

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# depspawn.cpp
# Opt level: O2

void depspawn::internal::common_wait_for(arg_info *pargs,int nargs)

{
  TaskPool *pTVar1;
  Workitem *this;
  Task *itask;
  bool was_run;
  char local_25;
  int local_24;
  arg_info *local_20;
  
  this = LinkedListPool<depspawn::internal::Workitem,true,false>::
         malloc<depspawn::internal::arg_info*&,int&>
                   ((LinkedListPool<depspawn::internal::Workitem,true,false> *)Workitem::Pool,
                    &local_20,&local_24);
  pTVar1 = TP;
  local_25 = '\0';
  itask = LinkedListPool<depspawn::internal::TaskPool::Task,_false,_false>::intl_malloc
                    (&TP->task_pool_);
  *(undefined8 *)((long)&(itask->func_).super__Function_base._M_functor + 8) = 0;
  *(char **)&(itask->func_).super__Function_base._M_functor = &local_25;
  (itask->func_)._M_invoker =
       std::
       _Function_handler<void_(),_std::_Bind<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/fraguela[P]depspawn/src/depspawn.cpp:315:47)_()>_>
       ::_M_invoke;
  (itask->func_).super__Function_base._M_manager =
       std::
       _Function_handler<void_(),_std::_Bind<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/fraguela[P]depspawn/src/depspawn.cpp:315:47)_()>_>
       ::_M_manager;
  itask->ctx_ = this;
  itask->next = (Task *)pTVar1;
  Workitem::insert_in_worklist(this,itask);
  while (local_25 == '\0') {
    TaskPool::try_run(TP);
  }
  return;
}

Assistant:

void common_wait_for(arg_info *pargs, int nargs)
    {
      internal::Workitem* w = internal::Workitem::Pool.malloc(pargs, nargs);

#ifdef DEPSPAWN_USE_TBB
      tbb::task* const dummy = new (tbb::task::allocate_root()) tbb::empty_task;
      dummy->set_ref_count(1 + 1);

      w->insert_in_worklist(new (dummy->allocate_child()) internal::runner<decltype(FV)>(w, FV));

      dummy->wait_for_all();
      dummy->destroy(*dummy);
#else
      volatile bool was_run = false;

      w->insert_in_worklist(TP->build_task(w, [&was_run](){ was_run = true; }));
      
      while (!was_run) {
        TP->try_run();
      }
#endif

    }